

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# happly.h
# Opt level: O3

vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
* __thiscall
happly::Element::getDataFromListPropertyRecursive<unsigned_long,unsigned_char>
          (vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           *__return_storage_ptr__,Element *this,Property *prop)

{
  byte *pbVar1;
  long lVar2;
  runtime_error *this_00;
  long *plVar3;
  size_type *psVar4;
  Tcan *v;
  byte *pbVar5;
  vector<unsigned_long,_std::allocator<unsigned_long>_> castedFlatVecCopy;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (prop != (Property *)0x0) {
    lVar2 = __dynamic_cast(prop,&Property::typeinfo,&TypedListProperty<unsigned_char>::typeinfo,0);
    if (lVar2 != 0) {
      local_128.field_2._M_allocated_capacity = 0;
      local_128._M_dataplus._M_p = (pointer)0x0;
      local_128._M_string_length = 0;
      geometrycentral::surface::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_128,
                 *(long *)(lVar2 + 0x30) - *(long *)(lVar2 + 0x28));
      pbVar5 = *(byte **)(lVar2 + 0x28);
      pbVar1 = *(byte **)(lVar2 + 0x30);
      if (pbVar5 != pbVar1) {
        do {
          local_108._M_dataplus._M_p = (pointer)(ulong)*pbVar5;
          if (local_128._M_string_length == local_128.field_2._M_allocated_capacity) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
            _M_realloc_insert<unsigned_long>
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_128,
                       (iterator)local_128._M_string_length,(unsigned_long *)&local_108);
          }
          else {
            *(pointer *)local_128._M_string_length = local_108._M_dataplus._M_p;
            local_128._M_string_length = local_128._M_string_length + 8;
          }
          pbVar5 = pbVar5 + 1;
        } while (pbVar5 != pbVar1);
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&local_e8,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)(lVar2 + 0x40));
      anon_unknown_3::unflattenList<unsigned_long>
                (__return_storage_ptr__,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_128,&local_e8);
      if (local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_128._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_128._M_dataplus._M_p);
      }
      return __return_storage_ptr__;
    }
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_b0,"PLY parser: list property ",&prop->name);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_b0);
  psVar4 = (size_type *)(plVar3 + 2);
  local_d0._M_dataplus._M_p = (pointer)*plVar3;
  if ((size_type *)local_d0._M_dataplus._M_p == psVar4) {
    local_d0.field_2._M_allocated_capacity = *psVar4;
    local_d0.field_2._8_8_ = plVar3[3];
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar4;
  }
  local_d0._M_string_length = plVar3[1];
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  local_70.field_2._M_allocated_capacity._0_4_ = 0x6e6b6e75;
  local_70.field_2._M_allocated_capacity._4_3_ = 0x6e776f;
  local_70._M_string_length = 7;
  local_70.field_2._M_local_buf[7] = '\0';
  std::operator+(&local_50,&local_d0,&local_70);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
  psVar4 = (size_type *)(plVar3 + 2);
  local_108._M_dataplus._M_p = (pointer)*plVar3;
  if ((size_type *)local_108._M_dataplus._M_p == psVar4) {
    local_108.field_2._M_allocated_capacity = *psVar4;
    local_108.field_2._8_8_ = plVar3[3];
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  }
  else {
    local_108.field_2._M_allocated_capacity = *psVar4;
  }
  local_108._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  (*prop->_vptr_Property[0xb])(&local_90,prop);
  std::operator+(&local_128,&local_108,&local_90);
  std::runtime_error::runtime_error(this_00,(string *)&local_128);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::vector<std::vector<D>> getDataFromListPropertyRecursive(Property* prop) {
    typedef typename CanonicalName<T>::type Tcan;

    TypedListProperty<Tcan>* castedProp = dynamic_cast<TypedListProperty<Tcan>*>(prop);
    if (castedProp) {
      // Succeeded, return a buffer of the data (copy while converting type)

      // Convert to flat buffer of new type
      std::vector<D>* castedFlatVec = nullptr;
      std::vector<D> castedFlatVecCopy; // we _might_ make a copy here, depending on is_same below

      if (std::is_same<std::vector<D>, std::vector<Tcan>>::value) {
        // just use the array we already have
        castedFlatVec = addressIfSame<std::vector<D>>(castedProp->flattenedData, 0 /* dummy arg to disambiguate */);
      } else {
        // make a copy
        castedFlatVecCopy.reserve(castedProp->flattenedData.size());
        for (Tcan& v : castedProp->flattenedData) {
          castedFlatVecCopy.push_back(static_cast<D>(v));
        }
        castedFlatVec = &castedFlatVecCopy;
      }

      // Unflatten and return
      return unflattenList(*castedFlatVec, castedProp->flattenedIndexStart);
    }

    TypeChain<Tcan> chainType;
    if (chainType.hasChildType) {
      return getDataFromListPropertyRecursive<D, typename TypeChain<Tcan>::type>(prop);
    } else {
      // No smaller type to try, failure
      throw std::runtime_error("PLY parser: list property " + prop->name +
                               " cannot be coerced to requested type list " + typeName<D>() + ". Has type list " +
                               prop->propertyTypeName());
    }
  }